

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

void __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse
          (AffixTokenMatcherWarehouse *this,AffixTokenMatcherSetupData *setupData)

{
  long lVar1;
  
  this->fSetupData = setupData;
  (this->fMinusSign).super_SymbolMatcher.fString.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e7ab8;
  (this->fMinusSign).super_SymbolMatcher.fString.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fMinusSign).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003db0b0;
  (this->fPlusSign).super_SymbolMatcher.fString.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e7ab8;
  (this->fPlusSign).super_SymbolMatcher.fString.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fPlusSign).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003db268;
  (this->fPercent).super_SymbolMatcher.fString.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e7ab8;
  (this->fPercent).super_SymbolMatcher.fString.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fPercent).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003db1b8;
  (this->fPermille).super_SymbolMatcher.fString.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e7ab8;
  (this->fPermille).super_SymbolMatcher.fString.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fPermille).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003db210;
  CombinedCurrencyMatcher::CombinedCurrencyMatcher(&this->fCurrency);
  lVar1 = -0x50;
  do {
    *(undefined ***)((long)(this->fCodePoints).codePointsOverflow.stackArray + lVar1 + -0x10) =
         &PTR__NumberParseMatcher_003dbea0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0);
  (this->fCodePoints).codePointsOverflow.ptr = (this->fCodePoints).codePointsOverflow.stackArray;
  (this->fCodePoints).codePointsOverflow.capacity = 3;
  (this->fCodePoints).codePointsOverflow.needToRelease = '\0';
  (this->fCodePoints).codePointCount = 0;
  (this->fCodePoints).codePointNumBatches = 0;
  return;
}

Assistant:

AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse(const AffixTokenMatcherSetupData* setupData)
        : fSetupData(setupData) {}